

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

uc_err reg_write_sparc(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  int iVar1;
  
  if (regid - 0x35 < 8) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)((long)_env + (ulong)(regid - 0x35) * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x4e < 8) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)(*(long *)((long)_env + 0x20) + -0x138 + (ulong)regid * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x46 < 8) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)(*(long *)((long)_env + 0x20) + -0xf8 + (ulong)regid * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x3d < 8) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)(*(long *)((long)_env + 0x20) + -0xb4 + (ulong)regid * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else {
    if (regid != 0x58) {
      return UC_ERR_ARG;
    }
    if (3 < *size) {
      *size = 4;
      iVar1 = *value;
      *(int *)((long)_env + 0x28) = iVar1;
      *(int *)((long)_env + 0x2c) = iVar1 + 4;
      *setpc = 1;
      return UC_ERR_OK;
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUSPARCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_SPARC_REG_G0 && regid <= UC_SPARC_REG_G7) {
        CHECK_REG_TYPE(uint32_t);
        env->gregs[regid - UC_SPARC_REG_G0] = *(uint32_t *)value;
    } else if (regid >= UC_SPARC_REG_O0 && regid <= UC_SPARC_REG_O7) {
        CHECK_REG_TYPE(uint32_t);
        env->regwptr[regid - UC_SPARC_REG_O0] = *(uint32_t *)value;
    } else if (regid >= UC_SPARC_REG_L0 && regid <= UC_SPARC_REG_L7) {
        CHECK_REG_TYPE(uint32_t);
        env->regwptr[8 + regid - UC_SPARC_REG_L0] = *(uint32_t *)value;
    } else if (regid >= UC_SPARC_REG_I0 && regid <= UC_SPARC_REG_I7) {
        CHECK_REG_TYPE(uint32_t);
        env->regwptr[16 + regid - UC_SPARC_REG_I0] = *(uint32_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_SPARC_REG_PC:
            CHECK_REG_TYPE(uint32_t);
            env->pc = *(uint32_t *)value;
            env->npc = *(uint32_t *)value + 4;
            *setpc = 1;
            break;
        }
    }

    return ret;
}